

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

void __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
insert_element_at(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                  *this,int *key,int payload,int pos)

{
  bool bVar1;
  int in_ECX;
  int in_EDX;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RSI;
  long in_RDI;
  byte local_21;
  int local_18;
  
  *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)in_ECX * 4) =
       *(undefined4 *)&(in_RSI->super_AlexNode<int,_int>)._vptr_AlexNode;
  *(int *)(*(long *)(in_RDI + 0x50) + (long)in_ECX * 4) = in_EDX;
  set_bit(in_RSI,in_EDX);
  local_18 = in_ECX + -1;
  while( true ) {
    local_21 = 0;
    if (-1 < local_18) {
      bVar1 = check_exists(in_RSI,in_EDX);
      local_21 = bVar1 ^ 0xff;
    }
    if ((local_21 & 1) == 0) break;
    *(undefined4 *)(*(long *)(in_RDI + 0x48) + (long)local_18 * 4) =
         *(undefined4 *)&(in_RSI->super_AlexNode<int,_int>)._vptr_AlexNode;
    local_18 = local_18 + -1;
  }
  return;
}

Assistant:

void insert_element_at(const T& key, P payload, int pos) {
#if ALEX_DATA_NODE_SEP_ARRAYS
    key_slots_[pos] = key;
    payload_slots_[pos] = payload;
#else
    data_slots_[index] = std::make_pair(key, payload);
#endif
    set_bit(pos);

    // Overwrite preceding gaps until we reach the previous element
    pos--;
    while (pos >= 0 && !check_exists(pos)) {
      ALEX_DATA_NODE_KEY_AT(pos) = key;
      pos--;
    }
  }